

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

bool __thiscall sentencepiece::NBestSentencePieceText::IsInitialized(NBestSentencePieceText *this)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::AllAreInitialized<sentencepiece::SentencePieceText>
                    (&this->nbests_);
  return bVar1;
}

Assistant:

bool NBestSentencePieceText::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(nbests_)) return false;
  return true;
}